

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O2

void soplex::
     SPxShellsort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
               (Breakpoint *keys,int end,BreakpointCompare *compare,int start)

{
  int iVar1;
  type_conflict5 tVar2;
  uint uVar3;
  int iVar4;
  undefined4 in_register_0000000c;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int local_1b4;
  ulong local_1b0;
  long local_1a8;
  long local_1a0;
  BreakpointCompare *local_198;
  ulong local_190;
  Breakpoint tempkey;
  Breakpoint local_130;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  Breakpoint local_88;
  
  local_1b0 = CONCAT44(in_register_0000000c,start);
  local_1a8 = (long)end;
  uVar3 = 2;
  local_198 = compare;
  do {
    if ((int)uVar3 < 0) {
      return;
    }
    uVar8 = (ulong)(uint)SPxShellsort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::BreakpointCompare>
                         ::incs[uVar3];
    iVar4 = SPxShellsort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::BreakpointCompare>
            ::incs[uVar3] + (int)local_1b0;
    uVar7 = local_1b0 & 0xffffffff;
    local_190 = uVar8;
    for (local_1a0 = (long)iVar4; local_1a0 <= local_1a8; local_1a0 = local_1a0 + 1) {
      SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Breakpoint::Breakpoint(&tempkey,keys + local_1a0);
      iVar5 = (int)uVar7;
      while (iVar1 = (int)uVar7, iVar6 = (int)uVar8 + iVar1, iVar4 <= iVar6) {
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::Breakpoint::Breakpoint(&local_130,&tempkey);
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::Breakpoint::Breakpoint(&local_88,keys + iVar1);
        uVar8 = local_190;
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::BreakpointCompare::operator()(&local_d8,local_198,&local_130,&local_88);
        local_1b4 = 0;
        tVar2 = boost::multiprecision::operator<(&local_d8,&local_1b4);
        if (!tVar2) break;
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::Breakpoint::operator=(keys + iVar6,keys + iVar1);
        uVar7 = (ulong)(uint)(iVar1 - (int)uVar8);
      }
      SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Breakpoint::operator=(keys + iVar6,&tempkey);
      uVar7 = (ulong)(iVar5 + 1);
    }
    uVar3 = uVar3 - 1;
  } while( true );
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}